

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int array_run_container_intersection_cardinality(array_container_t *src_1,run_container_t *src_2)

{
  _Bool _Var1;
  int local_30;
  uint16_t uStack_2c;
  uint16_t arrayval;
  int32_t newcard;
  rle16_t rle;
  int32_t arraypos;
  int32_t rlepos;
  run_container_t *src_2_local;
  array_container_t *src_1_local;
  
  _Var1 = run_container_is_full(src_2);
  if (_Var1) {
    src_1_local._4_4_ = src_1->cardinality;
  }
  else if (src_2->n_runs == 0) {
    src_1_local._4_4_ = 0;
  }
  else {
    rle.value = 0;
    rle.length = 0;
    newcard = 0;
    _uStack_2c = *src_2->runs;
    local_30 = 0;
    while (newcard < src_1->cardinality) {
      while (((uint)_uStack_2c & 0xffff) + ((uint)_uStack_2c >> 0x10) < (uint)src_1->array[newcard])
      {
        rle = (rle16_t)((int)rle + 1);
        if (rle == (rle16_t)src_2->n_runs) {
          return local_30;
        }
        _uStack_2c = src_2->runs[(int)rle];
      }
      if ((uint)src_1->array[newcard] < ((uint)_uStack_2c & 0xffff)) {
        newcard = advanceUntil(src_1->array,newcard,src_1->cardinality,uStack_2c);
      }
      else {
        local_30 = local_30 + 1;
        newcard = newcard + 1;
      }
    }
    src_1_local._4_4_ = local_30;
  }
  return src_1_local._4_4_;
}

Assistant:

int array_run_container_intersection_cardinality(const array_container_t *src_1,
                                                 const run_container_t *src_2) {
    if (run_container_is_full(src_2)) {
        return src_1->cardinality;
    }
    if (src_2->n_runs == 0) {
        return 0;
    }
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t rle = src_2->runs[rlepos];
    int32_t newcard = 0;
    while (arraypos < src_1->cardinality) {
        const uint16_t arrayval = src_1->array[arraypos];
        while (rle.value + rle.length <
               arrayval) {  // this will frequently be false
            ++rlepos;
            if (rlepos == src_2->n_runs) {
                return newcard;  // we are done
            }
            rle = src_2->runs[rlepos];
        }
        if (rle.value > arrayval) {
            arraypos = advanceUntil(src_1->array, arraypos, src_1->cardinality,
                                    rle.value);
        } else {
            newcard++;
            arraypos++;
        }
    }
    return newcard;
}